

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O0

void DecrementLoggerRefs(void)

{
  Lock *in_RAX;
  Locker locker;
  
  mau::Locker::Locker((Locker *)locker.TheLock,in_RAX);
  LoggerRefs = LoggerRefs - 1;
  mau::Locker::~Locker((Locker *)0x1074ca);
  return;
}

Assistant:

static void DecrementLoggerRefs()
{
    Locker locker(LoggerLock);

    --LoggerRefs;
    MAU_DEBUG_ASSERT(LoggerRefs >= 0);

#ifdef MAU_DLL
    // Stop logger when built as DLL
    if (LoggerRefs == 0)
        logger::Stop();
#endif
}